

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

int poptSaveBits(poptBits *bitsp,uint argInfo,char *s)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  char cVar4;
  char *s_00;
  char *pcVar5;
  char *pcVar6;
  
  iVar2 = -0x14;
  if ((s != (char *)0x0 && bitsp != (poptBits *)0x0) && (*s != '\0')) {
    _poptBitsNew(bitsp);
    sVar3 = strlen(s);
    __dest = (char *)malloc(sVar3 + 1);
    if (__dest == (char *)0x0) {
      fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
      exit(1);
    }
    strcpy(__dest,s);
    pcVar6 = __dest;
    do {
      do {
        s_00 = pcVar6;
        cVar1 = *s_00;
        cVar4 = cVar1;
        pcVar6 = s_00;
        if (cVar1 == '\0') {
          iVar2 = 0;
          goto LAB_00102e4f;
        }
        while (pcVar5 = pcVar6 + 1, cVar4 != '\0') {
          if (cVar4 == ',') {
            *pcVar6 = '\0';
            cVar1 = *s_00;
            pcVar6 = pcVar5;
            break;
          }
          pcVar6 = pcVar5;
          cVar4 = *pcVar5;
        }
      } while (cVar1 == '\0');
      if (cVar1 == '!') {
        iVar2 = poptBitsChk(*bitsp,s_00 + 1);
        if (0 < iVar2) {
          iVar2 = poptBitsDel(*bitsp,s_00 + 1);
        }
      }
      else {
        iVar2 = poptBitsAdd(*bitsp,s_00);
      }
    } while (iVar2 == 0);
LAB_00102e4f:
    free(__dest);
  }
  return iVar2;
}

Assistant:

int poptSaveBits(poptBits * bitsp,
		UNUSED(unsigned int argInfo), const char * s)
{
    char *tbuf = NULL;
    char *t, *te;
    int rc = 0;

    if (bitsp == NULL || s == NULL || *s == '\0' || _poptBitsNew(bitsp))
	return POPT_ERROR_NULLARG;

    /* Parse comma separated attributes. */
    te = tbuf = xstrdup(s);
    while ((t = te) != NULL && *t) {
	while (*te != '\0' && *te != ',')
	    te++;
	if (*te != '\0')
	    *te++ = '\0';
	/* XXX Ignore empty strings. */
	if (*t == '\0')
	    continue;
	/* XXX Permit negated attributes. caveat emptor: false negatives. */
	if (*t == '!') {
	    t++;
	    if ((rc = poptBitsChk(*bitsp, t)) > 0)
		rc = poptBitsDel(*bitsp, t);
	} else
	    rc = poptBitsAdd(*bitsp, t);
	if (rc)
	    break;
    }
    tbuf = _free(tbuf);
    return rc;
}